

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::Bone::AddChild(Bone *this,Bone *bone)

{
  pointer *ppuVar1;
  iterator __position;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (bone != (Bone *)0x0) {
    if ((bone->parentId != -1) && (bone->parent != (Bone *)0x0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_38,"Attaching child Bone that is already parented: ",&bone->name);
      std::runtime_error::runtime_error(this_00,(string *)&bStack_38);
      *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bone->parent = this;
    bone->parentId = (uint)this->id;
    __position._M_current =
         (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_realloc_insert<unsigned_short_const&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->children,__position
                 ,&bone->id);
      return;
    }
    *__position._M_current = bone->id;
    ppuVar1 = &(this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void Bone::AddChild(Bone *bone)
{
    if (!bone)
        return;
    if (bone->IsParented())
        throw DeadlyImportError("Attaching child Bone that is already parented: " + bone->name);

    bone->parent = this;
    bone->parentId = id;
    children.push_back(bone->id);
}